

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTOCTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar2 = derTLDec(&local_3c,&local_38,der,count);
  if ((sVar2 == 0xffffffffffffffff) || (uVar1 = local_38 + sVar2, count < uVar1)) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if ((uVar1 != 0xffffffffffffffff) && (local_3c == tag)) {
      if (val != (octet *)0x0) {
        memMove(val,der + sVar2,local_38);
      }
      uVar3 = uVar1;
      if (len != (size_t *)0x0) {
        *len = local_38;
      }
    }
  }
  return uVar3;
}

Assistant:

size_t derTOCTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
	{
		ASSERT(memIsValid(val, l));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l));
		memMove(val, v, l);
	}
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}